

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeModifyAssignment(ExpressionContext *ctx,SynModifyAssignment *syntax)

{
  uint uVar1;
  TypeBase *pTVar2;
  SynBase *source;
  long lVar3;
  FunctionLookupChain chain;
  FunctionLookupChain chain_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  SynBinaryOpType SVar7;
  ExprGetAddress *arg0;
  ExprBase *pEVar8;
  SmallDenseSet<TypePair,_TypePairHasher,_4U> *pSVar9;
  char *__s;
  size_t sVar10;
  ExprBase *pEVar11;
  undefined4 extraout_var;
  TypeRef *type;
  undefined4 extraout_var_00;
  VariableData *pVVar13;
  ExprBase *first;
  _func_int **pp_Var14;
  undefined4 extraout_var_03;
  ExprBase *pEVar15;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TypeBase *pTVar16;
  ExprGetAddress *pEVar17;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  InplaceStr name;
  FunctionLookupChain function_1;
  FunctionLookupChain function;
  TypePair typePair;
  SmallArray<ArgumentData,_1U> arguments;
  ArgumentData local_60;
  VariableHandle *pVVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  arg0 = (ExprGetAddress *)AnalyzeExpression(ctx,syntax->lhs);
  pEVar8 = AnalyzeExpression(ctx,syntax->rhs);
  pTVar16 = (arg0->super_ExprBase).type;
  if (((pTVar16 != (TypeBase *)0x0) && (pTVar16->typeID == 0)) ||
     ((pTVar2 = pEVar8->type, pTVar2 != (TypeBase *)0x0 && (pTVar2->typeID == 0))))
  goto LAB_001648ed;
  typePair.a = pTVar16;
  typePair.b = pTVar2;
  pSVar9 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_11U>::operator[]
                     (&ctx->noModifyOperatorForTypePair,
                      *(int *)&(syntax->super_SynBase).field_0x3c - 1);
  bVar4 = SmallDenseSet<TypePair,_TypePairHasher,_4U>::contains(pSVar9,&typePair);
  if (!bVar4) {
    __s = GetOpName(*(SynModifyAssignType *)&(syntax->super_SynBase).field_0x3c);
    sVar10 = strlen(__s);
    name.end = __s + sVar10;
    name.begin = __s;
    pEVar11 = CreateFunctionCall2(ctx,&syntax->super_SynBase,name,(ExprBase *)arg0,pEVar8,true,false
                                  ,true);
    if (pEVar11 != (ExprBase *)0x0) {
      return pEVar11;
    }
    pSVar9 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_11U>::operator[]
                       (&ctx->noModifyOperatorForTypePair,
                        *(int *)&(syntax->super_SynBase).field_0x3c - 1);
    SmallDenseSet<TypePair,_TypePairHasher,_4U>::insert(pSVar9,&typePair);
  }
  uVar1 = (arg0->super_ExprBase).typeID;
  if (uVar1 == 0x16) {
    pEVar17 = (ExprGetAddress *)arg0->variable;
  }
  else {
    pEVar17 = arg0;
    if (uVar1 == 0x29) {
      pVVar12 = arg0->variable;
      if ((((pVVar12 != (VariableHandle *)0x0) && (*(int *)&pVVar12->variable == 0x26)) &&
          (pVVar12[1].next != (VariableHandle *)0x0)) &&
         (*(char *)((long)&pVVar12[1].next[1].source + 1) == '\x01')) {
        SVar7 = anon_unknown.dwarf_b837c::GetBinaryOpType
                          (*(SynModifyAssignType *)&(syntax->super_SynBase).field_0x3c);
        pEVar11 = CreateBinaryOp(ctx,&syntax->super_SynBase,SVar7,(ExprBase *)arg0,pEVar8);
        if ((pEVar11->type != (TypeBase *)0x0) && (pEVar11->type->typeID == 0)) goto LAB_001648ed;
        arguments.allocator = ctx->allocator;
        arguments.data = arguments.little;
        arguments.little[0].source = (SynBase *)0x0;
        arguments.little[0].isExplicit = false;
        arguments.little[0].name = (SynIdentifier *)0x0;
        arguments.little[0].type = (TypeBase *)0x0;
        arguments.little[0].value = (ExprBase *)0x0;
        arguments.little[0].valueFunction = (FunctionData *)0x0;
        arguments.count = 0;
        arguments.max = 1;
        local_60.type = pEVar11->type;
        local_60.isExplicit = false;
        local_60.name = (SynIdentifier *)0x0;
        local_60.valueFunction = (FunctionData *)0x0;
        local_60.source = &syntax->super_SynBase;
        local_60.value = pEVar11;
        SmallArray<ArgumentData,_1U>::push_back(&arguments,&local_60);
        anon_unknown.dwarf_b837c::LookupFunctionChainByName
                  (&function,ctx,*(uint *)&pVVar12[1].next[2].source);
        if (function.node.node == (Node *)0x0) {
LAB_00164931:
          lVar3 = *(long *)&pVVar12[1].next[10].listed;
          if ((lVar3 == 0) ||
             (anon_unknown.dwarf_b837c::LookupFunctionChainByName
                        (&function_1,ctx,*(uint *)(lVar3 + 0x40)),
             function_1.node.node == (Node *)0x0)) {
            bVar4 = true;
            pEVar11 = (ExprBase *)0x0;
          }
          else {
            chain_00.node.node._0_4_ = (int)function_1.node.node;
            chain_00.node.start = function_1.node.start;
            chain_00.node.node._4_4_ = (int)((ulong)function_1.node.node >> 0x20);
            chain_00.scope._0_4_ = (int)function_1.scope;
            chain_00.scope._4_4_ = (int)((ulong)function_1.scope >> 0x20);
            pEVar11 = CreateFunctionAccess
                                (ctx,&syntax->super_SynBase,chain_00,
                                 *(ExprBase **)&pVVar12[1].listed);
            arguments_01.count = arguments.count;
            arguments_01.data = arguments.data;
            arguments_01._12_4_ = 0;
            pEVar11 = CreateFunctionCall(ctx,&syntax->super_SynBase,pEVar11,arguments_01,true);
            bVar4 = pEVar11 == (ExprBase *)0x0;
          }
        }
        else {
          chain.node.node._0_4_ = (int)function.node.node;
          chain.node.start = function.node.start;
          chain.node.node._4_4_ = (int)((ulong)function.node.node >> 0x20);
          chain.scope._0_4_ = (int)function.scope;
          chain.scope._4_4_ = (int)((ulong)function.scope >> 0x20);
          pEVar11 = CreateFunctionAccess
                              (ctx,&syntax->super_SynBase,chain,*(ExprBase **)&pVVar12[1].listed);
          arguments_00.count = arguments.count;
          arguments_00.data = arguments.data;
          arguments_00._12_4_ = 0;
          pEVar11 = CreateFunctionCall(ctx,&syntax->super_SynBase,pEVar11,arguments_00,true);
          if (pEVar11 == (ExprBase *)0x0) goto LAB_00164931;
          bVar4 = false;
        }
        SmallArray<ArgumentData,_1U>::~SmallArray(&arguments);
        if (!bVar4) {
          return pEVar11;
        }
      }
    }
    else if (uVar1 == 0x22) {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      source = (arg0->super_ExprBase).source;
      type = ExpressionContext::GetReferenceType(ctx,(arg0->super_ExprBase).type);
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pVVar12 = (VariableHandle *)CONCAT44(extraout_var_00,iVar6);
      pVVar13 = (VariableData *)arg0->variable;
      pVVar12->source = (arg0->super_ExprBase).source;
      pVVar12->variable = pVVar13;
      pVVar12->next = (VariableHandle *)0x0;
      pVVar12->listed = false;
      ExprGetAddress::ExprGetAddress
                ((ExprGetAddress *)CONCAT44(extraout_var,iVar5),source,&type->super_TypeBase,pVVar12
                );
      pEVar17 = (ExprGetAddress *)CONCAT44(extraout_var,iVar5);
    }
  }
  pTVar16 = (pEVar17->super_ExprBase).type;
  if ((pTVar16 == (TypeBase *)0x0) || (pTVar16->typeID != 0x12)) {
    pTVar16 = (arg0->super_ExprBase).type;
    anon_unknown.dwarf_b837c::Report
              (ctx,&syntax->super_SynBase,"ERROR: cannot change immutable value of type %.*s",
               (ulong)(uint)(*(int *)&(pTVar16->name).end - (int)(pTVar16->name).begin));
  }
  else {
    pVVar13 = anon_unknown.dwarf_b837c::AllocateTemporary(ctx,&syntax->super_SynBase,pTVar16);
    pEVar11 = CreateVariableAccess(ctx,&syntax->super_SynBase,pVVar13,false);
    pEVar11 = CreateAssignment(ctx,&syntax->super_SynBase,pEVar11,&pEVar17->super_ExprBase);
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    first = (ExprBase *)CONCAT44(extraout_var_01,iVar5);
    pTVar16 = ctx->typeVoid;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pp_Var14 = (_func_int **)CONCAT44(extraout_var_02,iVar5);
    *pp_Var14 = (_func_int *)0x0;
    pp_Var14[1] = (_func_int *)pVVar13;
    pp_Var14[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var14 + 3) = 0;
    first->typeID = 0x1e;
    first->source = &syntax->super_SynBase;
    first->type = pTVar16;
    first->next = (ExprBase *)0x0;
    first->listed = false;
    first->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a48;
    first[1]._vptr_ExprBase = pp_Var14;
    *(ExprBase **)&first[1].typeID = pEVar11;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar11 = (ExprBase *)CONCAT44(extraout_var_03,iVar5);
    pTVar16 = (arg0->super_ExprBase).type;
    pEVar15 = CreateVariableAccess(ctx,&syntax->super_SynBase,pVVar13,false);
    pEVar11->typeID = 0x16;
    pEVar11->source = &syntax->super_SynBase;
    pEVar11->type = pTVar16;
    pEVar11->next = (ExprBase *)0x0;
    pEVar11->listed = false;
    pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a80;
    pEVar11[1]._vptr_ExprBase = (_func_int **)pEVar15;
    SVar7 = anon_unknown.dwarf_b837c::GetBinaryOpType
                      (*(SynModifyAssignType *)&(syntax->super_SynBase).field_0x3c);
    pEVar11 = CreateBinaryOp(ctx,&syntax->super_SynBase,SVar7,pEVar11,pEVar8);
    if ((pEVar11->type == (TypeBase *)0x0) || (pEVar11->type->typeID != 0)) {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_04,iVar5);
      pTVar16 = (arg0->super_ExprBase).type;
      pEVar15 = CreateVariableAccess(ctx,&syntax->super_SynBase,pVVar13,false);
      pEVar8->typeID = 0x16;
      pEVar8->source = &syntax->super_SynBase;
      pEVar8->type = pTVar16;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a80;
      pEVar8[1]._vptr_ExprBase = (_func_int **)pEVar15;
      pEVar8 = CreateAssignment(ctx,&syntax->super_SynBase,pEVar8,pEVar11);
      pEVar8 = CreateSequence(ctx,&syntax->super_SynBase,first,pEVar8);
      return pEVar8;
    }
  }
LAB_001648ed:
  iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
  pTVar16 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  ExprError::ExprError
            ((ExprError *)CONCAT44(extraout_var_05,iVar5),&syntax->super_SynBase,pTVar16,
             (ExprBase *)arg0,pEVar8);
  return &((ExprError *)CONCAT44(extraout_var_05,iVar5))->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeModifyAssignment(ExpressionContext &ctx, SynModifyAssignment *syntax)
{
	ExprBase *lhs = AnalyzeExpression(ctx, syntax->lhs);
	ExprBase *rhs = AnalyzeExpression(ctx, syntax->rhs);

	if(isType<TypeError>(lhs->type) || isType<TypeError>(rhs->type))
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);

	TypePair typePair(lhs->type, rhs->type);

	if(!ctx.noModifyOperatorForTypePair[int(syntax->type) - 1].contains(typePair))
	{
		if(ExprBase *result = CreateFunctionCall2(ctx, syntax, InplaceStr(GetOpName(syntax->type)), lhs, rhs, true, false, true))
			return result;
		else
			ctx.noModifyOperatorForTypePair[int(syntax->type) - 1].insert(typePair);
	}

	// Unwrap modifiable pointer
	ExprBase* wrapped = lhs;

	if(ExprVariableAccess *node = getType<ExprVariableAccess>(lhs))
	{
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(lhs->source, ctx.GetReferenceType(lhs->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	}
	else if(ExprDereference *node = getType<ExprDereference>(lhs))
	{
		wrapped = node->value;
	}
	else if(ExprFunctionCall *node = getType<ExprFunctionCall>(lhs))
	{
		// Will try to transform 'get' accessor to 'set'
		if(ExprFunctionAccess *access = getType<ExprFunctionAccess>(node->function))
		{
			if(access->function && access->function->accessor)
			{
				ExprBase *result = CreateBinaryOp(ctx, syntax, GetBinaryOpType(syntax->type), lhs, rhs);

				if(isType<TypeError>(result->type))
					return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);

				SmallArray<ArgumentData, 1> arguments(ctx.allocator);
				arguments.push_back(ArgumentData(syntax, false, NULL, result->type, result));

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, access->function->nameHash))
				{
					ExprBase *overloads = CreateFunctionAccess(ctx, syntax, function, access->context);

					if(ExprBase *call = CreateFunctionCall(ctx, syntax, overloads, arguments, true))
						return call;
				}

				if(FunctionData *proto = access->function->proto)
				{
					if(FunctionLookupChain function = LookupFunctionChainByName(ctx, proto->nameHash))
					{
						ExprBase *overloads = CreateFunctionAccess(ctx, syntax, function, access->context);

						if(ExprBase *call = CreateFunctionCall(ctx, syntax, overloads, arguments, true))
							return call;
					}
				}
			}
		}
	}

	TypeRef *typeRef = getType<TypeRef>(wrapped->type);

	if(!typeRef)
	{
		Report(ctx, syntax, "ERROR: cannot change immutable value of type %.*s", FMT_ISTR(lhs->type->name));

		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);
	}

	VariableData *storage = AllocateTemporary(ctx, syntax, wrapped->type);

	ExprBase *assignment = CreateAssignment(ctx, syntax, CreateVariableAccess(ctx, syntax, storage, false), wrapped);

	ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

	ExprBase *lhsValue = new (ctx.get<ExprDereference>()) ExprDereference(syntax, lhs->type, CreateVariableAccess(ctx, syntax, storage, false));

	ExprBase *result = CreateBinaryOp(ctx, syntax, GetBinaryOpType(syntax->type), lhsValue, rhs);

	if(isType<TypeError>(result->type))
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);

	return CreateSequence(ctx, syntax, definition, CreateAssignment(ctx, syntax, new (ctx.get<ExprDereference>()) ExprDereference(syntax, lhs->type, CreateVariableAccess(ctx, syntax, storage, false)), result));
}